

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

void __thiscall Board::updateTiles(Board *this)

{
  iterator __position;
  bool bVar1;
  uint uVar2;
  reference ppTVar3;
  ostream *this_00;
  TileWire *in_RDI;
  uint x;
  uint y;
  TileGate *gate;
  iterator __end1_1;
  iterator __begin1_1;
  vector<TileGate_*,_std::allocator<TileGate_*>_> *__range1_1;
  TileLED *LED;
  iterator __end1;
  iterator __begin1;
  vector<TileLED_*,_std::allocator<TileLED_*>_> *__range1;
  iterator setIter;
  undefined1 in_stack_0000032f;
  string *in_stack_00000330;
  unordered_set<TileLED_*,_std::hash<TileLED_*>,_std::equal_to<TileLED_*>,_std::allocator<TileLED_*>_>
  *in_stack_fffffffffffffec8;
  unordered_set<TileGate_*,_std::hash<TileGate_*>,_std::equal_to<TileGate_*>,_std::allocator<TileGate_*>_>
  *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined4 in_stack_fffffffffffffed8;
  State in_stack_fffffffffffffedc;
  uint uVar4;
  uint local_114;
  uint local_110;
  uint in_stack_fffffffffffffefc;
  string local_100 [16];
  undefined8 in_stack_ffffffffffffff10;
  string local_e0 [16];
  TileSwitch *in_stack_ffffffffffffff30;
  State in_stack_ffffffffffffff3c;
  TileLED *in_stack_ffffffffffffff40;
  TileGate *in_stack_ffffffffffffff60;
  __normal_iterator<TileGate_**,_std::vector<TileGate_*,_std::allocator<TileGate_*>_>_> local_80;
  vector<TileGate_*,_std::allocator<TileGate_*>_> *local_78;
  TileLED *local_70;
  TileLED **local_68;
  __normal_iterator<TileLED_**,_std::vector<TileLED_*,_std::allocator<TileLED_*>_>_> local_60;
  vector<TileLED_*,_std::allocator<TileLED_*>_> *local_58;
  _Node_iterator_base<TileLED_*,_false> local_50;
  _Node_iterator_base<TileWire_*,_false> local_48;
  _Node_iterator_base<TileGate_*,_false> local_40;
  _Node_iterator_base<TileButton_*,_false> local_38;
  _Node_iterator_base<TileSwitch_*,_false> local_30;
  __node_type *local_28;
  _Node_iterator_base<TileGate_*,_false> local_20;
  _Node_iterator_base<TileGate_*,_false> local_18;
  _Node_iterator_base<TileGate_*,_false> local_10 [2];
  
  bVar1 = std::
          unordered_set<TileWire_*,_std::hash<TileWire_*>,_std::equal_to<TileWire_*>,_std::allocator<TileWire_*>_>
          ::empty((unordered_set<TileWire_*,_std::hash<TileWire_*>,_std::equal_to<TileWire_*>,_std::allocator<TileWire_*>_>
                   *)0x140a38);
  if ((((!bVar1) ||
       (bVar1 = std::
                unordered_set<TileGate_*,_std::hash<TileGate_*>,_std::equal_to<TileGate_*>,_std::allocator<TileGate_*>_>
                ::empty((unordered_set<TileGate_*,_std::hash<TileGate_*>,_std::equal_to<TileGate_*>,_std::allocator<TileGate_*>_>
                         *)0x140a4f), !bVar1)) ||
      (bVar1 = std::
               unordered_set<TileSwitch_*,_std::hash<TileSwitch_*>,_std::equal_to<TileSwitch_*>,_std::allocator<TileSwitch_*>_>
               ::empty((unordered_set<TileSwitch_*,_std::hash<TileSwitch_*>,_std::equal_to<TileSwitch_*>,_std::allocator<TileSwitch_*>_>
                        *)0x140a66), !bVar1)) ||
     ((bVar1 = std::
               unordered_set<TileButton_*,_std::hash<TileButton_*>,_std::equal_to<TileButton_*>,_std::allocator<TileButton_*>_>
               ::empty((unordered_set<TileButton_*,_std::hash<TileButton_*>,_std::equal_to<TileButton_*>,_std::allocator<TileButton_*>_>
                        *)0x140a7d), !bVar1 ||
      (bVar1 = std::
               unordered_set<TileLED_*,_std::hash<TileLED_*>,_std::equal_to<TileLED_*>,_std::allocator<TileLED_*>_>
               ::empty((unordered_set<TileLED_*,_std::hash<TileLED_*>,_std::equal_to<TileLED_*>,_std::allocator<TileLED_*>_>
                        *)0x140a94), !bVar1)))) {
    local_10[0]._M_cur =
         (__node_type *)
         std::
         unordered_set<TileGate_*,_std::hash<TileGate_*>,_std::equal_to<TileGate_*>,_std::allocator<TileGate_*>_>
         ::begin((unordered_set<TileGate_*,_std::hash<TileGate_*>,_std::equal_to<TileGate_*>,_std::allocator<TileGate_*>_>
                  *)in_stack_fffffffffffffec8);
    while( true ) {
      local_18._M_cur =
           (__node_type *)
           std::
           unordered_set<TileGate_*,_std::hash<TileGate_*>,_std::equal_to<TileGate_*>,_std::allocator<TileGate_*>_>
           ::end((unordered_set<TileGate_*,_std::hash<TileGate_*>,_std::equal_to<TileGate_*>,_std::allocator<TileGate_*>_>
                  *)in_stack_fffffffffffffec8);
      bVar1 = std::__detail::operator!=(local_10,&local_18);
      if (!bVar1) break;
      std::__detail::_Node_iterator<TileGate_*,_true,_false>::operator*
                ((_Node_iterator<TileGate_*,_true,_false> *)0x140af9);
      bVar1 = TileGate::updateNextState(in_stack_ffffffffffffff60);
      if (bVar1) {
        std::__detail::_Node_iterator<TileGate_*,_true,_false>::operator++
                  ((_Node_iterator<TileGate_*,_true,_false> *)in_stack_fffffffffffffed0);
      }
      else {
        local_28 = local_10[0]._M_cur;
        __position.super__Node_iterator_base<TileGate_*,_false>._M_cur._4_4_ =
             in_stack_fffffffffffffedc;
        __position.super__Node_iterator_base<TileGate_*,_false>._M_cur._0_4_ =
             in_stack_fffffffffffffed8;
        local_20._M_cur =
             (__node_type *)
             std::
             unordered_set<TileGate_*,_std::hash<TileGate_*>,_std::equal_to<TileGate_*>,_std::allocator<TileGate_*>_>
             ::erase(in_stack_fffffffffffffed0,__position);
        local_10[0]._M_cur = local_20._M_cur;
      }
    }
    while (bVar1 = std::
                   unordered_set<TileSwitch_*,_std::hash<TileSwitch_*>,_std::equal_to<TileSwitch_*>,_std::allocator<TileSwitch_*>_>
                   ::empty((unordered_set<TileSwitch_*,_std::hash<TileSwitch_*>,_std::equal_to<TileSwitch_*>,_std::allocator<TileSwitch_*>_>
                            *)0x140b6f), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_30._M_cur =
           (__node_type *)
           std::
           unordered_set<TileSwitch_*,_std::hash<TileSwitch_*>,_std::equal_to<TileSwitch_*>,_std::allocator<TileSwitch_*>_>
           ::begin((unordered_set<TileSwitch_*,_std::hash<TileSwitch_*>,_std::equal_to<TileSwitch_*>,_std::allocator<TileSwitch_*>_>
                    *)in_stack_fffffffffffffec8);
      std::__detail::_Node_iterator<TileSwitch_*,_true,_false>::operator*
                ((_Node_iterator<TileSwitch_*,_true,_false> *)0x140b9d);
      TileSwitch::updateOutput(in_stack_ffffffffffffff30);
    }
    while (bVar1 = std::
                   unordered_set<TileButton_*,_std::hash<TileButton_*>,_std::equal_to<TileButton_*>,_std::allocator<TileButton_*>_>
                   ::empty((unordered_set<TileButton_*,_std::hash<TileButton_*>,_std::equal_to<TileButton_*>,_std::allocator<TileButton_*>_>
                            *)0x140bba), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_38._M_cur =
           (__node_type *)
           std::
           unordered_set<TileButton_*,_std::hash<TileButton_*>,_std::equal_to<TileButton_*>,_std::allocator<TileButton_*>_>
           ::begin((unordered_set<TileButton_*,_std::hash<TileButton_*>,_std::equal_to<TileButton_*>,_std::allocator<TileButton_*>_>
                    *)in_stack_fffffffffffffec8);
      std::__detail::_Node_iterator<TileButton_*,_true,_false>::operator*
                ((_Node_iterator<TileButton_*,_true,_false> *)0x140be8);
      TileButton::updateOutput((TileButton *)in_stack_ffffffffffffff40);
    }
    while (bVar1 = std::
                   unordered_set<TileGate_*,_std::hash<TileGate_*>,_std::equal_to<TileGate_*>,_std::allocator<TileGate_*>_>
                   ::empty((unordered_set<TileGate_*,_std::hash<TileGate_*>,_std::equal_to<TileGate_*>,_std::allocator<TileGate_*>_>
                            *)0x140c05), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_40._M_cur =
           (__node_type *)
           std::
           unordered_set<TileGate_*,_std::hash<TileGate_*>,_std::equal_to<TileGate_*>,_std::allocator<TileGate_*>_>
           ::begin((unordered_set<TileGate_*,_std::hash<TileGate_*>,_std::equal_to<TileGate_*>,_std::allocator<TileGate_*>_>
                    *)in_stack_fffffffffffffec8);
      std::__detail::_Node_iterator<TileGate_*,_true,_false>::operator*
                ((_Node_iterator<TileGate_*,_true,_false> *)0x140c33);
      TileGate::updateOutput((TileGate *)in_stack_ffffffffffffff10);
    }
    while (bVar1 = std::
                   unordered_set<TileWire_*,_std::hash<TileWire_*>,_std::equal_to<TileWire_*>,_std::allocator<TileWire_*>_>
                   ::empty((unordered_set<TileWire_*,_std::hash<TileWire_*>,_std::equal_to<TileWire_*>,_std::allocator<TileWire_*>_>
                            *)0x140c50), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_48._M_cur =
           (__node_type *)
           std::
           unordered_set<TileWire_*,_std::hash<TileWire_*>,_std::equal_to<TileWire_*>,_std::allocator<TileWire_*>_>
           ::begin((unordered_set<TileWire_*,_std::hash<TileWire_*>,_std::equal_to<TileWire_*>,_std::allocator<TileWire_*>_>
                    *)in_stack_fffffffffffffec8);
      std::__detail::_Node_iterator<TileWire_*,_true,_false>::operator*
                ((_Node_iterator<TileWire_*,_true,_false> *)0x140c7e);
      TileWire::updateWire(in_RDI,in_stack_fffffffffffffedc);
    }
    while (bVar1 = std::
                   unordered_set<TileLED_*,_std::hash<TileLED_*>,_std::equal_to<TileLED_*>,_std::allocator<TileLED_*>_>
                   ::empty((unordered_set<TileLED_*,_std::hash<TileLED_*>,_std::equal_to<TileLED_*>,_std::allocator<TileLED_*>_>
                            *)0x140ca0), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_50._M_cur =
           (__node_type *)
           std::
           unordered_set<TileLED_*,_std::hash<TileLED_*>,_std::equal_to<TileLED_*>,_std::allocator<TileLED_*>_>
           ::begin(in_stack_fffffffffffffec8);
      std::__detail::_Node_iterator<TileLED_*,_true,_false>::operator*
                ((_Node_iterator<TileLED_*,_true,_false> *)0x140cce);
      TileLED::updateLED(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    }
    local_58 = &endpointLEDs;
    local_60._M_current =
         (TileLED **)
         std::vector<TileLED_*,_std::allocator<TileLED_*>_>::begin
                   ((vector<TileLED_*,_std::allocator<TileLED_*>_> *)in_stack_fffffffffffffec8);
    local_68 = (TileLED **)
               std::vector<TileLED_*,_std::allocator<TileLED_*>_>::end
                         ((vector<TileLED_*,_std::allocator<TileLED_*>_> *)in_stack_fffffffffffffec8
                         );
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<TileLED_**,_std::vector<TileLED_*,_std::allocator<TileLED_*>_>_>
                               *)in_stack_fffffffffffffed0,
                              (__normal_iterator<TileLED_**,_std::vector<TileLED_*,_std::allocator<TileLED_*>_>_>
                               *)in_stack_fffffffffffffec8), bVar1) {
      ppTVar3 = __gnu_cxx::
                __normal_iterator<TileLED_**,_std::vector<TileLED_*,_std::allocator<TileLED_*>_>_>::
                operator*(&local_60);
      local_70 = *ppTVar3;
      TileLED::updateLED(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      __gnu_cxx::__normal_iterator<TileLED_**,_std::vector<TileLED_*,_std::allocator<TileLED_*>_>_>
      ::operator++(&local_60);
    }
    std::vector<TileLED_*,_std::allocator<TileLED_*>_>::clear
              ((vector<TileLED_*,_std::allocator<TileLED_*>_> *)0x140d74);
    local_78 = &endpointGates;
    local_80._M_current =
         (TileGate **)
         std::vector<TileGate_*,_std::allocator<TileGate_*>_>::begin
                   ((vector<TileGate_*,_std::allocator<TileGate_*>_> *)in_stack_fffffffffffffec8);
    std::vector<TileGate_*,_std::allocator<TileGate_*>_>::end
              ((vector<TileGate_*,_std::allocator<TileGate_*>_> *)in_stack_fffffffffffffec8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<TileGate_**,_std::vector<TileGate_*,_std::allocator<TileGate_*>_>_>
                               *)in_stack_fffffffffffffed0,
                              (__normal_iterator<TileGate_**,_std::vector<TileGate_*,_std::allocator<TileGate_*>_>_>
                               *)in_stack_fffffffffffffec8), bVar1) {
      __gnu_cxx::
      __normal_iterator<TileGate_**,_std::vector<TileGate_*,_std::allocator<TileGate_*>_>_>::
      operator*(&local_80);
      std::
      unordered_set<TileGate_*,_std::hash<TileGate_*>,_std::equal_to<TileGate_*>,_std::allocator<TileGate_*>_>
      ::insert((unordered_set<TileGate_*,_std::hash<TileGate_*>,_std::equal_to<TileGate_*>,_std::allocator<TileGate_*>_>
                *)in_RDI,(value_type *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)
              );
      __gnu_cxx::
      __normal_iterator<TileGate_**,_std::vector<TileGate_*,_std::allocator<TileGate_*>_>_>::
      operator++(&local_80);
    }
    std::vector<TileGate_*,_std::allocator<TileGate_*>_>::clear
              ((vector<TileGate_*,_std::allocator<TileGate_*>_> *)0x140e21);
    TileButton::updateTransitioningButtons();
    uVar4 = Tile::currentUpdateTime;
    uVar2 = std::numeric_limits<unsigned_int>::max();
    if (uVar4 == uVar2) {
      std::numeric_limits<unsigned_int>::max();
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100;
      std::__cxx11::to_string(in_stack_fffffffffffffefc);
      std::operator+((char *)CONCAT44(uVar4,in_stack_fffffffffffffed8),__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(uVar4,in_stack_fffffffffffffed8),(char *)__rhs);
      UserInterface::pushMessage(in_stack_00000330,(bool)in_stack_0000032f);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
      std::__cxx11::string::~string(local_e0);
      std::__cxx11::string::~string(local_100);
      for (local_110 = 0; local_110 < *(uint *)((long)&in_RDI[2].super_Tile._boardPtr + 4);
          local_110 = local_110 + 1) {
        for (local_114 = 0; local_114 < *(uint *)&in_RDI[2].super_Tile._boardPtr;
            local_114 = local_114 + 1) {
          (**(code **)(**(long **)(*(long *)((long)in_RDI[2].super_Tile._position +
                                            (ulong)local_110 * 8) + (ulong)local_114 * 8) + 0x60))()
          ;
        }
      }
      Tile::currentUpdateTime = 1;
      this_00 = std::operator<<((ostream *)&std::cout,"Tiles reset.");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
    else {
      Tile::currentUpdateTime = Tile::currentUpdateTime + 1;
    }
  }
  return;
}

Assistant:

void Board::updateTiles() {
    assert(endpointLEDs.empty());
    assert(endpointGates.empty());
    if (wireUpdates.empty() && gateUpdates.empty() && switchUpdates.empty() && buttonUpdates.empty() && LEDUpdates.empty()) {
        return;
    }
    /*if (!wireUpdates.empty() || !gateUpdates.empty() || !switchUpdates.empty() || !buttonUpdates.empty() || !LEDUpdates.empty()) {
        cout << "\nUpdates scheduled: w" << wireUpdates.size() << " g" << gateUpdates.size() << " s" << switchUpdates.size() << " b" << buttonUpdates.size() << " L" << LEDUpdates.size() << endl;
    }*/
    
    //cout << "---- GATE STATE CHECKS ----" << endl;
    for (auto setIter = gateUpdates.begin(); setIter != gateUpdates.end();) {    // Check state transitions for all gates (keep update only if gate changed).
        if ((*setIter)->updateNextState()) {
            ++setIter;
        } else {
            setIter = gateUpdates.erase(setIter);
        }
    }
    
    //cout << "---- SWITCH UPDATES ----" << endl;
    while (!switchUpdates.empty()) {    // Update all pending switches.
        (*switchUpdates.begin())->updateOutput();
    }
    //cout << "---- BUTTON UPDATES ----" << endl;
    while (!buttonUpdates.empty()) {    // Update all pending buttons.
        (*buttonUpdates.begin())->updateOutput();
    }
    //cout << "---- GATE UPDATES ----" << endl;
    while (!gateUpdates.empty()) {    // Update all pending gates that were left over from before.
        (*gateUpdates.begin())->updateOutput();
    }
    
    //cout << "---- REMAINING WIRES AND LEDS ----" << endl;
    while (!wireUpdates.empty()) {
        //cout << "Found a remaining wire update." << endl;
        (*wireUpdates.begin())->updateWire(LOW);
    }
    while (!LEDUpdates.empty()) {
        //cout << "Found a remaining LED update." << endl;
        (*LEDUpdates.begin())->updateLED(LOW);
    }
    
    //cout << "LED endpoints:" << endl;
    for (TileLED* LED : endpointLEDs) {
        //cout << "  (" << LED->getPosition().x << ", " << LED->getPosition().y << ")" << endl;
        LED->updateLED(LOW);
    }
    endpointLEDs.clear();
    //cout << "Gate endpoints:" << endl;
    for (TileGate* gate : endpointGates) {
        //cout << "  (" << gate->getPosition().x << ", " << gate->getPosition().y << ")" << endl;
        gateUpdates.insert(gate);
    }
    endpointGates.clear();
    
    TileButton::updateTransitioningButtons();
    //cout << endl;
    if (Tile::currentUpdateTime == numeric_limits<unsigned int>::max()) {
        UserInterface::pushMessage("Update counter has reached max value (" + to_string(numeric_limits<unsigned int>::max()) + " updates), resetting tiles...");
        for (unsigned int y = 0; y < _size.y; ++y) {
            for (unsigned int x = 0; x < _size.x; ++x) {
                _tileArray[y][x]->fixUpdateTime();
            }
        }
        Tile::currentUpdateTime = 1;
        cout << "Tiles reset." << endl;
    } else {
        ++Tile::currentUpdateTime;
    }
}